

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::NodeTranslator::readEmbed
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,NodeTranslator *this,
          Reader filename)

{
  Resolver *pRVar1;
  ErrorReporter *pEVar2;
  size_t sVar3;
  CapTableReader *pCVar4;
  WirePointer *pWVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  Reader RVar9;
  char cVar10;
  long in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  ArrayDisposer *pAStack_80;
  String local_78;
  PointerReader local_58;
  ArrayPtr<const_char> local_38;
  
  pRVar1 = this->resolver;
  local_58.capTable = filename._reader.capTable;
  local_58.pointer = filename._reader.pointers;
  local_58.segment = filename._reader.segment;
  local_58.nestingLimit = filename._reader.nestingLimit;
  if (filename._reader.pointerCount == 0) {
    local_58.capTable = (CapTableReader *)0x0;
    local_58.pointer = (WirePointer *)0x0;
    local_58.segment = (SegmentReader *)0x0;
    local_58.nestingLimit = 0x7fffffff;
  }
  RVar9 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_58,(void *)0x0,0);
  (*pRVar1->_vptr_Resolver[9])(&local_58,pRVar1,RVar9.super_StringPtr.content.ptr);
  pWVar5 = local_58.pointer;
  pCVar4 = local_58.capTable;
  cVar10 = (char)local_58.segment;
  if ((char)local_58.segment == '\x01') {
    pAStack_80 = (ArrayDisposer *)CONCAT44(local_58._28_4_,local_58.nestingLimit);
    local_58.capTable = (CapTableReader *)0x0;
    local_58.pointer = (WirePointer *)0x0;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.ptr = (uchar *)pCVar4;
    (__return_storage_ptr__->ptr).field_1.value.size_ = (size_t)pWVar5;
    (__return_storage_ptr__->ptr).field_1.value.disposer = pAStack_80;
    in_stack_ffffffffffffff70 = 0;
    in_stack_ffffffffffffff78 = 0;
  }
  else {
    if (filename._reader.pointerCount == 0) {
      filename._reader.nestingLimit = 0x7fffffff;
      filename._reader.capTable = (CapTableReader *)0x0;
      filename._reader.pointers = (WirePointer *)0x0;
      filename._reader.segment = (SegmentReader *)0x0;
    }
    pEVar2 = this->errorReporter;
    local_58.segment = filename._reader.segment;
    local_58.capTable = filename._reader.capTable;
    local_58.pointer = filename._reader.pointers;
    local_58.nestingLimit = filename._reader.nestingLimit;
    RVar9 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_58,(void *)0x0,0);
    local_38.ptr = RVar9.super_StringPtr.content.ptr;
    local_58.segment = (SegmentReader *)0x56984a;
    local_58.capTable = (CapTableReader *)0x1e;
    local_38.size_ = RVar9.super_StringPtr.content.size_ - 1;
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&local_78,(_ *)&local_58,&local_38,&local_38);
    pcVar6 = local_78.content.ptr;
    if (local_78.content.size_ == 0) {
      pcVar6 = "";
    }
    uVar7 = 0;
    uVar8 = 0;
    if (0x1f < filename._reader.dataSize) {
      uVar8 = (ulong)*filename._reader.data;
    }
    if (0x3f < filename._reader.dataSize) {
      uVar7 = (ulong)*(uint *)((long)filename._reader.data + 4);
    }
    (**pEVar2->_vptr_ErrorReporter)
              (pEVar2,uVar8,uVar7,pcVar6,local_78.content.size_ + (local_78.content.size_ == 0));
    sVar3 = local_78.content.size_;
    pcVar6 = local_78.content.ptr;
    if (local_78.content.ptr != (char *)0x0) {
      local_78.content.ptr = (char *)0x0;
      local_78.content.size_ = 0;
      (**(local_78.content.disposer)->_vptr_ArrayDisposer)
                (local_78.content.disposer,pcVar6,1,sVar3,sVar3,0);
    }
    (__return_storage_ptr__->ptr).isSet = false;
  }
  if ((cVar10 == '\x01') && (in_stack_ffffffffffffff70 != 0)) {
    (**pAStack_80->_vptr_ArrayDisposer)
              (pAStack_80,in_stack_ffffffffffffff70,1,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff78,0,1,0,0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> NodeTranslator::readEmbed(LocatedText::Reader filename) {
  KJ_IF_MAYBE(data, resolver.readEmbed(filename.getValue())) {
    return kj::mv(*data);
  } else {
    errorReporter.addErrorOn(filename,
        kj::str("Couldn't read file for embed: ", filename.getValue()));
    return nullptr;
  }